

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codebuilder.cpp
# Opt level: O0

Error __thiscall asmjit::CodeBuilder::embed(CodeBuilder *this,void *data,uint32_t size)

{
  CBData *node_00;
  Error in_EDX;
  CodeEmitter *in_RSI;
  long in_RDI;
  uint32_t unaff_retaddr;
  void *in_stack_00000008;
  CBData *node;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 local_8;
  
  if (*(int *)(in_RDI + 0x2c) == 0) {
    node_00 = newDataNode((CodeBuilder *)node,in_stack_00000008,unaff_retaddr);
    if (node_00 == (CBData *)0x0) {
      local_8 = CodeEmitter::setLastError(in_RSI,in_EDX,(char *)0x0);
    }
    else {
      addNode((CodeBuilder *)CONCAT44(in_EDX,in_stack_ffffffffffffffe0),&node_00->super_CBNode);
      local_8 = 0;
    }
  }
  else {
    local_8 = *(Error *)(in_RDI + 0x2c);
  }
  return local_8;
}

Assistant:

Error CodeBuilder::embed(const void* data, uint32_t size) {
  if (_lastError) return _lastError;

  CBData* node = newDataNode(data, size);
  if (ASMJIT_UNLIKELY(!node))
    return setLastError(DebugUtils::errored(kErrorNoHeapMemory));

  addNode(node);
  return kErrorOk;
}